

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void high_pass_filter(vector<float,_std::allocator<float>_> *data,float cutoff,float sample_rate)

{
  pointer pfVar1;
  pointer pfVar2;
  size_t i;
  ulong uVar3;
  float fVar4;
  
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar2 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  fVar4 = *pfVar1;
  for (uVar3 = 1; uVar3 < (ulong)((long)pfVar2 - (long)pfVar1 >> 2); uVar3 = uVar3 + 1) {
    fVar4 = ((fVar4 + pfVar1[uVar3]) - pfVar1[uVar3 - 1]) *
            ((1.0 / sample_rate) / (1.0 / (cutoff * 6.2831855) + 1.0 / sample_rate));
    pfVar1[uVar3] = fVar4;
  }
  return;
}

Assistant:

void high_pass_filter(std::vector<float> & data, float cutoff, float sample_rate) {
    const float rc = 1.0f / (2.0f * M_PI * cutoff);
    const float dt = 1.0f / sample_rate;
    const float alpha = dt / (rc + dt);

    float y = data[0];

    for (size_t i = 1; i < data.size(); i++) {
        y = alpha * (y + data[i] - data[i - 1]);
        data[i] = y;
    }
}